

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O2

size_t __thiscall OtherHashAlgAndValue::SetDataSize(OtherHashAlgAndValue *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = DerBase::EncodedSize(&(this->hashAlgorithm).super_DerBase);
  sVar2 = DerBase::EncodedSize(&(this->hashValue).super_DerBase);
  (this->super_DerBase).cbData = sVar2 + sVar1;
  return sVar2 + sVar1;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData = hashAlgorithm.EncodedSize() + hashValue.EncodedSize();
		return cbData;
	}